

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::setResizeGripsVisible(QColumnView *this,bool visible)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QColumnViewPrivate *pQVar4;
  const_iterator signal;
  const_iterator o;
  byte in_SIL;
  Object *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  QColumnViewGrip *grip;
  QAbstractItemView *view;
  add_const_t<QList<QAbstractItemView_*>_> *__range1;
  QColumnViewPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  code *__x;
  QAbstractScrollArea *in_stack_ffffffffffffff60;
  QWidget *in_stack_ffffffffffffff68;
  QWidget *in_stack_ffffffffffffff70;
  vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffffb8;
  Connection local_28;
  const_iterator slot;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  pQVar4 = d_func((QColumnView *)0x861bd4);
  if ((pQVar4->showResizeGrips & 1U) != (bVar2 & 1)) {
    pQVar4->showResizeGrips = (bool)(bVar2 & 1);
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::clear
              ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)0x861c1f
              );
    signal = QList<QAbstractItemView_*>::begin
                       ((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff60);
    o = QList<QAbstractItemView_*>::end((QList<QAbstractItemView_*> *)in_stack_ffffffffffffff60);
    while (slot = o,
          bVar3 = QList<QAbstractItemView_*>::const_iterator::operator!=
                            ((const_iterator *)&stack0xfffffffffffffff0,o), bVar3) {
      QList<QAbstractItemView_*>::const_iterator::operator*
                ((const_iterator *)&stack0xfffffffffffffff0);
      if ((bVar2 & 1) == 0) {
        QAbstractScrollArea::cornerWidget(in_stack_ffffffffffffff60);
        QAbstractScrollArea::setCornerWidget
                  ((QAbstractScrollArea *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        QObject::deleteLater();
      }
      else {
        in_stack_ffffffffffffff70 = (QWidget *)operator_new(0x28);
        QColumnViewGrip::QColumnViewGrip
                  ((QColumnViewGrip *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
        QAbstractScrollArea::setCornerWidget
                  ((QAbstractScrollArea *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff78 = &pQVar4->gripConnections;
        __x = QColumnViewPrivate::gripMoved;
        in_stack_ffffffffffffff60 = (QAbstractScrollArea *)0x0;
        QObjectPrivate::connect<void(QColumnViewGrip::*)(int),void(QColumnViewPrivate::*)(int)>
                  (in_RDI,(offset_in_QColumnViewGrip_to_subr)signal.i,
                   (Object *)CONCAT17(bVar2,in_stack_ffffffffffffffb8),(Function)slot.i,
                   (ConnectionType)((ulong)pQVar4 >> 0x20));
        std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::push_back
                  ((vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_> *)
                   in_stack_ffffffffffffff60,(value_type *)__x);
        QMetaObject::Connection::~Connection(&local_28);
      }
      QList<QAbstractItemView_*>::const_iterator::operator++
                ((const_iterator *)&stack0xfffffffffffffff0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnView::setResizeGripsVisible(bool visible)
{
    Q_D(QColumnView);
    if (d->showResizeGrips == visible)
        return;
    d->showResizeGrips = visible;
    d->gripConnections.clear();
    for (QAbstractItemView *view : std::as_const(d->columns)) {
        if (visible) {
            QColumnViewGrip *grip = new QColumnViewGrip(view);
            view->setCornerWidget(grip);
            d->gripConnections.push_back(
                QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                        d, &QColumnViewPrivate::gripMoved)
            );
        } else {
            QWidget *widget = view->cornerWidget();
            view->setCornerWidget(nullptr);
            widget->deleteLater();
        }
    }
}